

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

seed_t lest::seed(text *opt,text *arg)

{
  char *pcVar1;
  pointer pcVar2;
  int iVar3;
  char *pcVar4;
  seed_t sVar5;
  runtime_error *this;
  long *plVar6;
  long lVar7;
  size_type *psVar8;
  long *plVar9;
  char *pcVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  char *local_70 [2];
  char local_60 [16];
  char *local_50;
  ulong local_48;
  char local_40 [16];
  
  pcVar2 = (arg->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + arg->_M_string_length);
  pcVar1 = local_50 + local_48;
  pcVar4 = local_50;
  if (0 < (long)local_48 >> 2) {
    pcVar4 = local_50 + (local_48 & 0xfffffffffffffffc);
    lVar7 = ((long)local_48 >> 2) + 1;
    pcVar10 = local_50 + 3;
    do {
      if ((int)pcVar10[-3] - 0x3aU < 0xfffffff6) {
        pcVar10 = pcVar10 + -3;
        goto LAB_00108235;
      }
      if ((int)pcVar10[-2] - 0x3aU < 0xfffffff6) {
        pcVar10 = pcVar10 + -2;
        goto LAB_00108235;
      }
      if ((int)pcVar10[-1] - 0x3aU < 0xfffffff6) {
        pcVar10 = pcVar10 + -1;
        goto LAB_00108235;
      }
      if ((int)*pcVar10 - 0x3aU < 0xfffffff6) goto LAB_00108235;
      lVar7 = lVar7 + -1;
      pcVar10 = pcVar10 + 4;
    } while (1 < lVar7);
  }
  lVar7 = (long)pcVar1 - (long)pcVar4;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      pcVar10 = pcVar1;
      if ((lVar7 != 3) || (pcVar10 = pcVar4, (int)*pcVar4 - 0x3aU < 0xfffffff6)) goto LAB_00108235;
      pcVar4 = pcVar4 + 1;
    }
    pcVar10 = pcVar4;
    if ((int)*pcVar4 - 0x3aU < 0xfffffff6) goto LAB_00108235;
    pcVar4 = pcVar4 + 1;
  }
  pcVar10 = pcVar4;
  if (0xfffffff5 < (int)*pcVar4 - 0x3aU) {
    pcVar10 = pcVar1;
  }
LAB_00108235:
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (pcVar10 == pcVar1) {
    pcVar2 = (arg->_M_dataplus)._M_p;
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,pcVar2,pcVar2 + arg->_M_string_length);
    lVar7 = strtol(local_70[0],(char **)0x0,10);
    sVar5 = (seed_t)(int)lVar7;
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)arg);
    if (iVar3 != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_b0,"expecting \'time\' or positive number with option \'",opt);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_f0._M_dataplus._M_p = (pointer)*plVar6;
      psVar8 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_f0._M_dataplus._M_p == psVar8) {
        local_f0.field_2._M_allocated_capacity = *psVar8;
        local_f0.field_2._8_8_ = plVar6[3];
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      }
      else {
        local_f0.field_2._M_allocated_capacity = *psVar8;
      }
      local_f0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::operator+(&local_90,&local_f0,arg);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_d0 = (long *)*plVar6;
      plVar9 = plVar6 + 2;
      if (local_d0 == plVar9) {
        local_c0 = *plVar9;
        lStack_b8 = plVar6[3];
        local_d0 = &local_c0;
      }
      else {
        local_c0 = *plVar9;
      }
      local_c8 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::runtime_error::runtime_error(this,(string *)&local_d0);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    sVar5 = std::chrono::_V2::system_clock::now();
  }
  return sVar5;
}

Assistant:

inline seed_t seed( text opt, text arg )
{
    if ( is_number( arg ) )
        return static_cast<seed_t>( lest::stoi( arg ) );

    if ( arg == "time" )
        return static_cast<seed_t>( std::chrono::high_resolution_clock::now().time_since_epoch().count() );

    throw std::runtime_error( "expecting 'time' or positive number with option '" + opt + "', got '" + arg + "' (try option --help)" );
}